

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_util_tracesnap(lua_State *L)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  TValue *pTVar6;
  ulong uVar7;
  uint narray;
  ulong uVar8;
  long lVar9;
  GCtab *t;
  
  uVar4 = lj_lib_checkint(L,1);
  if ((uVar4 == 0) || (uVar7 = (ulong)(L->glref).ptr32, *(uint *)(uVar7 + 0x3c4) <= uVar4)) {
    lj_lib_checkint(L,2);
    iVar5 = 0;
  }
  else {
    uVar7 = (ulong)*(uint *)(*(long *)(uVar7 + 0x3b8) + (ulong)uVar4 * 4);
    uVar4 = lj_lib_checkint(L,2);
    iVar5 = 0;
    if ((uVar7 != 0) && (uVar4 < *(ushort *)(uVar7 + 6))) {
      puVar1 = (uint *)(*(long *)(uVar7 + 0x20) + (ulong)uVar4 * 0xc);
      uVar4 = *puVar1;
      lVar3 = *(long *)(uVar7 + 0x28);
      uVar7 = (ulong)*(byte *)((long)puVar1 + 10);
      narray = (uint)(uVar7 + 2);
      lua_createtable(L,narray,0);
      t = (GCtab *)(ulong)L->top[-1].u32.lo;
      if (t->asize == 0) {
        pTVar6 = lj_tab_setinth(L,t,0);
      }
      else {
        pTVar6 = (TValue *)(ulong)(t->array).ptr32;
      }
      pTVar6->n = (double)(int)((ushort)puVar1[1] - 0x8000);
      if (t->asize < 2) {
        pTVar6 = lj_tab_setinth(L,t,1);
      }
      else {
        pTVar6 = (TValue *)((ulong)(t->array).ptr32 + 8);
      }
      pTVar6->n = (double)(byte)puVar1[2];
      if (uVar7 != 0) {
        uVar8 = 2;
        lVar9 = 0x10;
        do {
          if (uVar8 < t->asize) {
            pTVar6 = (TValue *)((ulong)(t->array).ptr32 + lVar9);
          }
          else {
            pTVar6 = lj_tab_setinth(L,t,(int32_t)uVar8);
          }
          pTVar6->n = (double)*(int *)((ulong)uVar4 * 4 + lVar3 + -8 + uVar8 * 4);
          lVar9 = lVar9 + 8;
          lVar2 = uVar8 - uVar7;
          uVar8 = uVar8 + 1;
        } while (lVar2 != 1);
      }
      if (narray < t->asize) {
        pTVar6 = (TValue *)((ulong)(t->array).ptr32 + (uVar7 + 2) * 8);
      }
      else {
        pTVar6 = lj_tab_setinth(L,t,narray);
      }
      pTVar6->u64 = 0xc170000000000000;
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

LJLIB_CF(jit_util_tracesnap)
{
  GCtrace *T = jit_checktrace(L);
  SnapNo sn = (SnapNo)lj_lib_checkint(L, 2);
  if (T && sn < T->nsnap) {
    SnapShot *snap = &T->snap[sn];
    SnapEntry *map = &T->snapmap[snap->mapofs];
    MSize n, nent = snap->nent;
    GCtab *t;
    lua_createtable(L, nent+2, 0);
    t = tabV(L->top-1);
    setintV(lj_tab_setint(L, t, 0), (int32_t)snap->ref - REF_BIAS);
    setintV(lj_tab_setint(L, t, 1), (int32_t)snap->nslots);
    for (n = 0; n < nent; n++)
      setintV(lj_tab_setint(L, t, (int32_t)(n+2)), (int32_t)map[n]);
    setintV(lj_tab_setint(L, t, (int32_t)(nent+2)), (int32_t)SNAP(255, 0, 0));
    return 1;
  }
  return 0;
}